

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall duckdb_re2::Compiler::Match(Compiler *this,int32_t match_id)

{
  uint uVar1;
  Compiler *this_00;
  Frag FVar3;
  uint32_t uStack_20;
  uint uStack_1c;
  ulong uVar2;
  
  this_00 = this;
  uVar1 = AllocInst(this,1);
  if ((int)uVar1 < 0) {
    FVar3 = NoMatch(this_00);
    uVar2 = FVar3._0_8_;
    uStack_20 = FVar3.end.tail;
    uStack_1c = CONCAT31(uStack_1c._1_3_,FVar3.nullable);
  }
  else {
    Prog::Inst::InitMatch
              ((this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + uVar1,match_id
              );
    uStack_20 = 0;
    uStack_1c = uStack_1c & 0xffffff00;
    uVar2 = (ulong)uVar1;
  }
  FVar3._12_4_ = uStack_1c;
  FVar3.end.tail = uStack_20;
  FVar3.begin = (int)uVar2;
  FVar3.end.head = (int)(uVar2 >> 0x20);
  return FVar3;
}

Assistant:

Frag Compiler::Match(int32_t match_id) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  inst_[id].InitMatch(match_id);
  return Frag(id, kNullPatchList, false);
}